

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O2

size_t u32CLZ(u32 w)

{
  size_t sVar1;
  uint uVar2;
  
  uVar2 = w | w >> 1;
  uVar2 = uVar2 | uVar2 >> 2;
  uVar2 = uVar2 | uVar2 >> 4;
  uVar2 = uVar2 | uVar2 >> 8;
  sVar1 = u32Weight(~(uVar2 | uVar2 >> 0x10));
  return sVar1;
}

Assistant:

size_t SAFE(u32CLZ)(register u32 w)
{
	w = w | w >> 1;
	w = w | w >> 2;
	w = w | w >> 4;
	w = w | w >> 8;
	w = w | w >> 16;
	return u32Weight(~w);
}